

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh_test.cc
# Opt level: O2

void __thiscall ECDHTest_WycheproofP224_Test::TestBody(ECDHTest_WycheproofP224_Test *this)

{
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = RunWycheproofTest;
  local_10 = std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_invoke;
  local_18 = std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_manager;
  FileTestGTest("third_party/wycheproof_testvectors/ecdh_secp224r1_test.txt",
                (function<void_(FileTest_*)> *)local_28);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return;
}

Assistant:

TEST(ECDHTest, WycheproofP224) {
  FileTestGTest("third_party/wycheproof_testvectors/ecdh_secp224r1_test.txt",
                RunWycheproofTest);
}